

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O0

cTValue * lj_meta_cache(GCtab *mt,MMS mm,GCstr *name)

{
  GCstr *in_RDX;
  byte in_SIL;
  GCtab *in_RDI;
  cTValue *mo;
  cTValue *local_8;
  
  local_8 = lj_tab_getstr(in_RDI,in_RDX);
  if ((local_8 == (cTValue *)0x0) || ((local_8->field_2).it == 0xffffffff)) {
    in_RDI->nomm = in_RDI->nomm | (byte)(1 << (in_SIL & 0x1f));
    local_8 = (cTValue *)0x0;
  }
  return local_8;
}

Assistant:

cTValue *lj_meta_cache(GCtab *mt, MMS mm, GCstr *name)
{
  cTValue *mo = lj_tab_getstr(mt, name);
  lj_assertX(mm <= MM_FAST, "bad metamethod %d", mm);
  if (!mo || tvisnil(mo)) {  /* No metamethod? */
    mt->nomm |= (uint8_t)(1u<<mm);  /* Set negative cache flag. */
    return NULL;
  }
  return mo;
}